

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

TPZMatrix<double> * __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::CreateAssemble
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZBaseMatrix *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  long lVar1;
  int iVar2;
  TPZManVector<int,_10> *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t in_RDX;
  undefined8 in_RSI;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *in_RDI;
  int nrigid;
  TPZSubCompMesh *subcmesh;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *mat;
  TPZManVector<int,_10> numelconnected;
  int64_t neq;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>
  *in_stack_00000290;
  TPZEquationFilter *in_stack_ffffffffffffff08;
  TPZFront<double> *in_stack_ffffffffffffff10;
  TPZSubCompMesh *in_stack_ffffffffffffff18;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>
  *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  TPZManVector<int,_10> *in_stack_ffffffffffffff40;
  undefined1 local_a0 [12];
  int local_94;
  long local_90;
  TPZManVector<int,_10> *local_78;
  undefined4 local_6c;
  int64_t local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  TPZStrMatParInterface::InitCreateAssemble
            ((TPZStrMatParInterface *)
             (&(in_RDI->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<double>,_10>.field_0x78 +
             *(long *)(*(long *)&(in_RDI->fStorage).fEqnStack.
                                 super_TPZManVector<TPZEqnArray<double>,_10>.field_0x78 + -0x60)));
  local_20 = TPZEquationFilter::NActiveEquations(in_stack_ffffffffffffff08);
  local_6c = 0;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  pTVar3 = (TPZManVector<int,_10> *)operator_new(0x1fb60);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::TPZFrontMatrix
            (in_RDI,in_RDX);
  local_78 = pTVar3;
  iVar2 = (*(((TPZBaseMatrix *)&pTVar3->super_TPZVec<int>)->super_TPZSavable)._vptr_TPZSavable[0x4f]
          )();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x50))
            ((long *)CONCAT44(extraout_var,iVar2),
             *(undefined4 *)
              &(in_RDI->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<double>,_10>.field_0xa4);
  lVar1 = (in_RDI->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix
          .fRow;
  if (lVar1 == 0) {
    local_90 = 0;
  }
  else {
    local_90 = __dynamic_cast(lVar1,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
  }
  if ((local_90 != 0) &&
     (local_94 = TPZSubCompMesh::NumberRigidBodyModes(in_stack_ffffffffffffff18), 0 < local_94)) {
    iVar2 = (*(((TPZBaseMatrix *)&local_78->super_TPZVec<int>)->super_TPZSavable)._vptr_TPZSavable
              [0x4f])();
    in_stack_ffffffffffffff20 =
         (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
         CONCAT44(extraout_var_00,iVar2);
    TPZFront<double>::SetNumRigidBodyModes
              (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  }
  GetNumElConnected((TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>
                     *)numelconnected.fExtAlloc._0_8_,
                    (TPZVec<int> *)numelconnected.super_TPZVec<int>.fNAlloc);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::SetNumElConnected
            (in_stack_ffffffffffffff20,(TPZVec<int> *)in_stack_ffffffffffffff18);
  OrderElement(in_stack_00000290);
  pTVar3 = local_78;
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)local_78,
             (TPZAutoPointer<TPZGuiInterface> *)in_stack_ffffffffffffff08);
  (*(in_RDI->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xc])(in_RDI,pTVar3,local_10,local_a0);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)pTVar3);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::FinishWriting
            ((TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
             0x1db892c);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::ReOpen
            ((TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
             0x1db893b);
  TPZManVector<int,_10>::~TPZManVector(pTVar3);
  return (TPZMatrix<double> *)local_78;
}

Assistant:

TPZMatrix<TVar> * TPZFrontStructMatrix<TFront,TVar,TPar>::CreateAssemble(TPZBaseMatrix &rhs, TPZAutoPointer<TPZGuiInterface> guiInterface){
	TPar::InitCreateAssemble();
    int64_t neq = this->fEquationFilter.NActiveEquations();
	TPZManVector <int> numelconnected(neq,0);
	TPZFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront> *mat = new TPZFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront>(neq);//(this->fMesh->NEquations());
	
//	TPZFrontMatrix<TVar,TPZFileEqnStorage<TVar>, TFront> *mat = new TPZFrontMatrix<TVar,TPZFileEqnStorage<TVar>, TFront>(neq);
    mat->GetFront().SetDecomposeType(fDecomposeType);
	// if the frontal matrix is applied to a submesh, we assume there may be rigid body modes
	TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *> (this->fMesh);	
	if (subcmesh) {
		int nrigid = subcmesh->NumberRigidBodyModes();
		if (nrigid > 0) {
			mat->GetFront().SetNumRigidBodyModes(nrigid);
			
		}
	}
	
	GetNumElConnected(numelconnected);
	mat->SetNumElConnected(numelconnected);
	
	OrderElement();
	
	Assemble(*mat,rhs,guiInterface);
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
        mat->FinishWriting();
        mat->ReOpen();
//		mat->Print("Frontal matrix", sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
	mat->FinishWriting();
	mat->ReOpen();
	return mat;
}